

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementInstancer.cpp
# Opt level: O1

ElementPtr __thiscall
Rml::ElementInstancerText::InstanceElement
          (ElementInstancerText *this,Element *param_1,String *tag,XMLAttributes *param_3)

{
  int iVar1;
  int iVar2;
  ObserverPtrBlock *pOVar3;
  code *pcVar4;
  undefined8 uVar5;
  bool bVar6;
  ElementText *this_00;
  
  if (element_instancer_pools._8_8_ == 0) {
    bVar6 = Assert("Resource used before it was initialized, or after it was shut down.",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                   ,0x46);
    if (!bVar6) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
  }
  uVar5 = element_instancer_pools._8_8_;
  if (*(long *)(element_instancer_pools._8_8_ + 0x40) == 0) {
    if (*(char *)(element_instancer_pools._8_8_ + 0x2c) == '\x01') {
      Pool<Rml::ElementText>::CreateChunk
                ((Pool<Rml::ElementText> *)(element_instancer_pools._8_8_ + 0x28));
      if (*(long *)(uVar5 + 0x40) != 0) goto LAB_0022d7f9;
    }
    this_00 = (ElementText *)0x0;
  }
  else {
LAB_0022d7f9:
    iVar2 = *(int *)(uVar5 + 0x48);
    iVar1 = iVar2 + 1;
    *(int *)(uVar5 + 0x48) = iVar1;
    if (*(int *)(uVar5 + 0x4c) <= iVar2) {
      *(int *)(uVar5 + 0x4c) = iVar1;
    }
    this_00 = *(ElementText **)(uVar5 + 0x40);
    pOVar3 = this_00[1].super_Element.super_EnableObserverPtr<Rml::Element>.block;
    *(ObserverPtrBlock **)(uVar5 + 0x40) = pOVar3;
    if (pOVar3 != (ObserverPtrBlock *)0x0) {
      pOVar3[0x1f].pointed_to_object = (void *)0x0;
    }
    pOVar3 = *(ObserverPtrBlock **)(uVar5 + 0x38);
    if (pOVar3 == (ObserverPtrBlock *)0x0) {
      this_00[1].super_Element.super_ScriptInterface.super_Releasable._vptr_Releasable =
           (_func_int **)0x0;
      this_00[1].super_Element.super_EnableObserverPtr<Rml::Element>.block = (ObserverPtrBlock *)0x0
      ;
    }
    else {
      this_00[1].super_Element.super_ScriptInterface.super_Releasable._vptr_Releasable =
           (_func_int **)0x0;
      this_00[1].super_Element.super_EnableObserverPtr<Rml::Element>.block = pOVar3;
      pOVar3[0x1f].pointed_to_object = this_00;
    }
    *(ElementText **)(uVar5 + 0x38) = this_00;
    ElementText::ElementText(this_00,(String *)param_3);
  }
  (this->super_ElementInstancer)._vptr_ElementInstancer = (_func_int **)this_00;
  return (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
         (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)this;
}

Assistant:

ElementPtr ElementInstancerText::InstanceElement(Element* /*parent*/, const String& tag, const XMLAttributes& /*attributes*/)
{
	ElementText* ptr = element_instancer_pools->pool_text_default.AllocateAndConstruct(tag);
	return ElementPtr(static_cast<Element*>(ptr));
}